

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

void __thiscall
mat_lib::base_matrix<double>::setFractionalDigits(base_matrix<double> *this,int fractionalDigits)

{
  logic_error *this_00;
  int fractionalDigits_local;
  base_matrix<double> *this_local;
  
  if (fractionalDigits < 1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"bad decimal precision");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  this->fractional_digits__ = fractionalDigits;
  return;
}

Assistant:

void base_matrix<T>::setFractionalDigits(int fractionalDigits) {
        if (fractionalDigits <= 0) throw logic_error("bad decimal precision");

        fractional_digits__ = fractionalDigits;
    }